

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

ImportDefinition * __thiscall
flatbuffers::ts::TsGenerator::AddImport<flatbuffers::EnumDef>
          (ImportDefinition *__return_storage_ptr__,TsGenerator *this,import_set *imports,
          Definition *dependent,EnumDef *dependency)

{
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Namespace *pNVar2;
  pointer pbVar3;
  pointer pbVar4;
  Namer *pNVar5;
  TsGenerator *this_01;
  Definition *pDVar6;
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *this_02;
  bool has_name_clash;
  iterator iVar7;
  long *plVar8;
  ImportDefinition *extraout_RAX;
  ImportDefinition *pIVar9;
  _Alloc_hider *p_Var10;
  ulong *puVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  char *pcVar15;
  char *__end;
  EnumDef *enum_def;
  string import_extension;
  string rel_file_path;
  string bare_file_path;
  string name;
  string unique_name;
  string object_name;
  string import_name;
  string symbols_expression;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  string local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  Namer *local_270;
  EnumDef *local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  ImportDefinition *local_220;
  TsGenerator *local_218;
  Definition *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [32];
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  *local_188;
  string local_180;
  undefined1 local_160 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  long lStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50;
  
  this_00 = &this->namer_;
  local_210 = dependent;
  IdlNamer::NamespacedType_abi_cxx11_((string *)local_1a8,this_00,&dependency->super_Definition);
  iVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
          ::find(imports,(string *)local_1a8);
  pDVar6 = local_210;
  if ((_Rb_tree_header *)iVar7._M_node != &(imports->_M_t)._M_impl.super__Rb_tree_header) {
    anon_unknown_10::ImportDefinition::ImportDefinition
              (__return_storage_ptr__,(ImportDefinition *)(iVar7._M_node + 2));
    goto LAB_0023c72c;
  }
  local_270 = &this_00->super_Namer;
  local_268 = dependency;
  local_220 = __return_storage_ptr__;
  local_218 = this;
  (*(this_00->super_Namer)._vptr_Namer[0xf])(local_160,this_00,dependency);
  pIVar9 = (ImportDefinition *)local_160._0_8_;
  has_name_clash =
       CheckIfNameClashes((TsGenerator *)imports,(import_set *)local_160._0_8_,
                          (string *)local_160._8_8_);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  if (has_name_clash) {
    local_160._8_8_ = local_1a8._8_8_;
    pIVar9 = (ImportDefinition *)local_1a8._0_8_;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pIVar9,
             (long)&(((ImportDefinition *)local_160._8_8_)->name)._M_dataplus._M_p + (long)pIVar9);
  this_01 = local_218;
  enum_def = local_268;
  if (has_name_clash) {
    IdlNamer::NamespacedType_abi_cxx11_
              (&local_180,(IdlNamer *)local_270,&local_268->super_Definition);
  }
  else {
    (*((Namer *)&local_270->_vptr_Namer)->_vptr_Namer[0xf])(&local_180,local_270,local_268);
  }
  local_188 = (map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
               *)imports;
  GenSymbolExpression(&local_50,this_01,enum_def,has_name_clash,(string *)local_160,&local_1e8,
                      &local_180);
  local_240 = &local_230;
  local_238 = 0;
  local_230 = 0;
  local_260 = &local_250;
  local_258 = 0;
  local_250 = 0;
  pNVar2 = pDVar6->defined_namespace;
  if ((pNVar2->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pNVar2->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_0023bdc6:
    std::__cxx11::string::append((char *)&local_260);
  }
  else {
    uVar14 = 0;
    do {
      if (uVar14 == 0) {
        local_140._M_allocated_capacity = (size_type)&local_130;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"..","");
      }
      else {
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"..","");
        plVar8 = (long *)std::__cxx11::string::insert((ulong)local_1c8,0,'\x01');
        p_Var10 = (_Alloc_hider *)(plVar8 + 2);
        if ((_Alloc_hider *)*plVar8 == p_Var10) {
          local_130._M_p = p_Var10->_M_p;
          lStack_128 = plVar8[3];
          local_140._M_allocated_capacity = (size_type)&local_130;
        }
        else {
          local_130._M_p = p_Var10->_M_p;
          local_140._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar8;
        }
        local_140._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
      }
      std::__cxx11::string::_M_append((char *)&local_260,local_140._M_allocated_capacity);
      if ((_Alloc_hider *)local_140._M_allocated_capacity != &local_130) {
        operator_delete((void *)local_140._M_allocated_capacity,(ulong)(local_130._M_p + 1));
      }
      if ((uVar14 != 0) && (local_1c8[0] != local_1b8)) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      uVar14 = uVar14 + 1;
      pbVar3 = (pNVar2->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (pNVar2->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar14 < (ulong)((long)pbVar4 - (long)pbVar3 >> 5));
    enum_def = local_268;
    if (pbVar4 == pbVar3) goto LAB_0023bdc6;
  }
  pNVar5 = local_270;
  Namer::Directories(&local_2b0,local_270,
                     &((enum_def->super_Definition).defined_namespace)->components,OutputPath,
                     kUpperCamel);
  plVar8 = (long *)std::__cxx11::string::insert((ulong)&local_2b0,0,'\x01');
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_2c0 = *puVar11;
    uStack_2b8 = (undefined4)plVar8[3];
    uStack_2b4 = *(undefined4 *)((long)plVar8 + 0x1c);
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar11;
    local_2d0 = (ulong *)*plVar8;
  }
  local_2c8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  (*pNVar5->_vptr_Namer[0xc])(&local_2f0,pNVar5,enum_def,3);
  uVar14 = 0xf;
  if (local_2d0 != &local_2c0) {
    uVar14 = local_2c0;
  }
  if (uVar14 < (ulong)(local_2e8 + local_2c8)) {
    uVar14 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar14 = local_2e0;
    }
    if (uVar14 < (ulong)(local_2e8 + local_2c8)) goto LAB_0023beb8;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_2d0)
    ;
  }
  else {
LAB_0023beb8:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_2f0);
  }
  local_140._M_allocated_capacity = (size_type)&local_130;
  p_Var10 = (_Alloc_hider *)(plVar8 + 2);
  if ((_Alloc_hider *)*plVar8 == p_Var10) {
    local_130._M_p = p_Var10->_M_p;
    lStack_128 = plVar8[3];
  }
  else {
    local_130._M_p = p_Var10->_M_p;
    local_140._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar8;
  }
  local_140._8_8_ = plVar8[1];
  *plVar8 = (long)p_Var10;
  plVar8[1] = 0;
  *(undefined1 *)&p_Var10->_M_p = 0;
  std::__cxx11::string::_M_append((char *)&local_240,local_140._M_allocated_capacity);
  if ((_Alloc_hider *)local_140._M_allocated_capacity != &local_130) {
    operator_delete((void *)local_140._M_allocated_capacity,(ulong)(local_130._M_p + 1));
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  paVar1 = &local_2b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_240);
  pIVar9 = local_220;
  (local_220->name)._M_dataplus._M_p = (pointer)&(local_220->name).field_2;
  (local_220->name)._M_string_length = 0;
  (local_220->name).field_2._M_local_buf[0] = '\0';
  (local_220->import_statement)._M_dataplus._M_p = (pointer)&(local_220->import_statement).field_2;
  (local_220->import_statement)._M_string_length = 0;
  (local_220->import_statement).field_2._M_local_buf[0] = '\0';
  (local_220->export_statement)._M_dataplus._M_p = (pointer)&(local_220->export_statement).field_2;
  (local_220->export_statement)._M_string_length = 0;
  (local_220->export_statement).field_2._M_local_buf[0] = '\0';
  (local_220->bare_file_path)._M_dataplus._M_p = (pointer)&(local_220->bare_file_path).field_2;
  (local_220->bare_file_path)._M_string_length = 0;
  (local_220->bare_file_path).field_2._M_local_buf[0] = '\0';
  (local_220->rel_file_path)._M_dataplus._M_p = (pointer)&(local_220->rel_file_path).field_2;
  (local_220->rel_file_path)._M_string_length = 0;
  (local_220->rel_file_path).field_2._M_local_buf[0] = '\0';
  (local_220->object_name)._M_dataplus._M_p = (pointer)&(local_220->object_name).field_2;
  (local_220->object_name)._M_string_length = 0;
  (local_220->object_name).field_2._M_local_buf[0] = '\0';
  local_220->dependent = (Definition *)0x0;
  local_220->dependency = (Definition *)0x0;
  std::__cxx11::string::_M_assign((string *)local_220);
  std::__cxx11::string::_M_assign((string *)&pIVar9->object_name);
  std::__cxx11::string::_M_assign((string *)&pIVar9->bare_file_path);
  std::__cxx11::string::_M_assign((string *)&pIVar9->rel_file_path);
  uVar14 = (ulong)(((local_218->super_BaseGenerator).parser_)->opts).ts_no_import_ext;
  pcVar15 = ".js";
  if (uVar14 != 0) {
    pcVar15 = "";
  }
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,pcVar15,pcVar15 + (uVar14 ^ 1) * 3);
  std::operator+(&local_208,"import { ",&local_50);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_208);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_280 = *plVar12;
    lStack_278 = plVar8[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar12;
    local_290 = (long *)*plVar8;
  }
  local_288 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_260);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_2e0 = *puVar11;
    lStack_2d8 = plVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar11;
    local_2f0 = (ulong *)*plVar8;
  }
  local_2e8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_2b0.field_2._M_allocated_capacity = *psVar13;
    local_2b0.field_2._8_8_ = plVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar13;
    local_2b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  p_Var10 = (_Alloc_hider *)(plVar8 + 2);
  if ((_Alloc_hider *)*plVar8 == p_Var10) {
    local_130._M_p = p_Var10->_M_p;
    lStack_128 = plVar8[3];
    local_140._M_allocated_capacity = (size_type)&local_130;
  }
  else {
    local_130._M_p = p_Var10->_M_p;
    local_140._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar8;
  }
  local_140._8_8_ = plVar8[1];
  *plVar8 = (long)p_Var10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)&pIVar9->import_statement,(string *)local_140._M_local_buf);
  if ((_Alloc_hider *)local_140._M_allocated_capacity != &local_130) {
    operator_delete((void *)local_140._M_allocated_capacity,(ulong)(local_130._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_208,"export { ",&local_50);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_208);
  local_290 = &local_280;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_280 = *plVar12;
    lStack_278 = plVar8[3];
  }
  else {
    local_280 = *plVar12;
    local_290 = (long *)*plVar8;
  }
  local_288 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_240);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_2e0 = *puVar11;
    lStack_2d8 = plVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar11;
    local_2f0 = (ulong *)*plVar8;
  }
  local_2e8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_2d0);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_2b0.field_2._M_allocated_capacity = *psVar13;
    local_2b0.field_2._8_8_ = plVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar13;
    local_2b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  p_Var10 = (_Alloc_hider *)(plVar8 + 2);
  if ((_Alloc_hider *)*plVar8 == p_Var10) {
    local_130._M_p = p_Var10->_M_p;
    lStack_128 = plVar8[3];
    local_140._M_allocated_capacity = (size_type)&local_130;
  }
  else {
    local_130._M_p = p_Var10->_M_p;
    local_140._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar8;
  }
  local_140._8_8_ = plVar8[1];
  *plVar8 = (long)p_Var10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)&pIVar9->export_statement,(string *)local_140._M_local_buf);
  if ((_Alloc_hider *)local_140._M_allocated_capacity != &local_130) {
    operator_delete((void *)local_140._M_allocated_capacity,(ulong)(local_130._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  pDVar6 = local_210;
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  this_02 = local_188;
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pIVar9->dependency = &local_268->super_Definition;
  pIVar9->dependent = pDVar6;
  std::make_pair<std::__cxx11::string_const&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
              *)&local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_,
             (ImportDefinition *)local_1a8._8_8_);
  std::
  map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
  ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
            (this_02,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
                      *)&local_140);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0]._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0._M_allocated_capacity + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110._M_allocated_capacity + 1);
  }
  if ((_Alloc_hider *)local_140._M_allocated_capacity != &local_130) {
    operator_delete((void *)local_140._M_allocated_capacity,(ulong)(local_130._M_p + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((ImportDefinition *)local_160._0_8_ != (ImportDefinition *)(local_160 + 0x10)) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
LAB_0023c72c:
  pIVar9 = (ImportDefinition *)(local_1a8 + 0x10);
  if ((ImportDefinition *)local_1a8._0_8_ != pIVar9) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    pIVar9 = extraout_RAX;
  }
  return pIVar9;
}

Assistant:

ImportDefinition AddImport(import_set &imports, const Definition &dependent,
                             const DefinitionT &dependency) {
    // The unique name of the dependency, fully qualified in its namespace.
    const std::string unique_name = GetTypeName(
        dependency, /*object_api = */ false, /*force_ns_wrap=*/true);

    // Look if we have already added this import and return its name if found.
    const auto import_pair = imports.find(unique_name);
    if (import_pair != imports.end()) { return import_pair->second; }

    // Check if this name would have a name clash with another type. Just use
    // the "base" name (properly escaped) without any namespacing applied.
    const std::string import_name = GetTypeName(dependency);
    const bool has_name_clash = CheckIfNameClashes(imports, import_name);

    // If we have a name clash, use the unique name, otherwise use simple name.
    std::string name = has_name_clash ? unique_name : import_name;

    const std::string object_name =
        GetTypeName(dependency, /*object_api=*/true, has_name_clash);

    const std::string symbols_expression = GenSymbolExpression(
        dependency, has_name_clash, import_name, name, object_name);

    std::string bare_file_path;
    std::string rel_file_path;
    const auto &dep_comps = dependent.defined_namespace->components;
    for (size_t i = 0; i < dep_comps.size(); i++) {
      rel_file_path += i == 0 ? ".." : (kPathSeparator + std::string(".."));
    }
    if (dep_comps.size() == 0) { rel_file_path += "."; }

    bare_file_path +=
        kPathSeparator +
        namer_.Directories(dependency.defined_namespace->components,
                           SkipDir::OutputPath) +
        namer_.File(dependency, SkipFile::SuffixAndExtension);
    rel_file_path += bare_file_path;

    ImportDefinition import;
    import.name = name;
    import.object_name = object_name;
    import.bare_file_path = bare_file_path;
    import.rel_file_path = rel_file_path;
    std::string import_extension = parser_.opts.ts_no_import_ext ? "" : ".js";
    import.import_statement = "import { " + symbols_expression + " } from '" +
                              rel_file_path + import_extension + "';";
    import.export_statement = "export { " + symbols_expression + " } from '." +
                              bare_file_path + import_extension + "';";
    import.dependency = &dependency;
    import.dependent = &dependent;

    imports.insert(std::make_pair(unique_name, import));

    return import;
  }